

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint32 uVar4;
  uint8 *puVar5;
  FieldOptions *this_00;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    uVar4 = (uint32)psVar2->_M_string_length;
    if (uVar4 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar5);
  }
  if ((this->_has_bits_[0] & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,SERIALIZE)
    ;
    psVar2 = this->extendee_;
    *target = '\x12';
    uVar4 = (uint32)psVar2->_M_string_length;
    if (uVar4 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar5);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    uVar1 = this->number_;
    *target = '\x18';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    uVar1 = this->label_;
    *target = ' ';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 8) != 0) {
    uVar1 = this->type_;
    *target = '(';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->type_name_->_M_dataplus)._M_p,(int)this->type_name_->_M_string_length,
               SERIALIZE);
    psVar2 = this->type_name_;
    *target = '2';
    uVar4 = (uint32)psVar2->_M_string_length;
    if (uVar4 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar5);
  }
  if ((this->_has_bits_[0] & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->default_value_->_M_dataplus)._M_p,(int)this->default_value_->_M_string_length,
               SERIALIZE);
    psVar2 = this->default_value_;
    *target = ':';
    uVar4 = (uint32)psVar2->_M_string_length;
    if (uVar4 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar5);
  }
  if ((this->_has_bits_[0] & 0x80) != 0) {
    this_00 = this->options_;
    if (this_00 == (FieldOptions *)0x0) {
      this_00 = *(FieldOptions **)(default_instance_ + 0x38);
    }
    *target = 'B';
    uVar1 = this_00->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar5 = target + 2;
    }
    else {
      puVar5 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = FieldOptions::SerializeWithCachedSizesToArray(this_00,puVar5);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}